

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::static_huffman_data_model::clear(static_huffman_data_model *this)

{
  unsigned_short *p;
  uchar *p_00;
  decoder_tables *p_01;
  uint32 *puVar1;
  uint16 *puVar2;
  
  this->m_total_syms = 0;
  p = (this->m_codes).m_p;
  if (p != (unsigned_short *)0x0) {
    crnlib_free(p);
    (this->m_codes).m_p = (unsigned_short *)0x0;
    (this->m_codes).m_size = 0;
    (this->m_codes).m_capacity = 0;
  }
  p_00 = (this->m_code_sizes).m_p;
  if (p_00 != (uchar *)0x0) {
    crnlib_free(p_00);
    (this->m_code_sizes).m_p = (uchar *)0x0;
    (this->m_code_sizes).m_size = 0;
    (this->m_code_sizes).m_capacity = 0;
  }
  p_01 = this->m_pDecode_tables;
  if (p_01 != (decoder_tables *)0x0) {
    puVar1 = p_01->m_lookup;
    if ((puVar1 != (uint32 *)0x0) && ((puVar1[-2] ^ puVar1[-1]) == 0xffffffff)) {
      crnlib_free(puVar1 + -4);
    }
    puVar2 = p_01->m_sorted_symbol_order;
    if ((puVar2 != (uint16 *)0x0) &&
       ((*(uint *)(puVar2 + -4) ^ *(uint *)(puVar2 + -2)) == 0xffffffff)) {
      crnlib_free(puVar2 + -8);
    }
    crnlib_free(p_01);
    this->m_pDecode_tables = (decoder_tables *)0x0;
  }
  this->m_encoding = false;
  return;
}

Assistant:

void static_huffman_data_model::clear() {
  m_total_syms = 0;
  m_codes.clear();
  m_code_sizes.clear();
  if (m_pDecode_tables) {
    crnlib_delete(m_pDecode_tables);
    m_pDecode_tables = NULL;
  }
  m_encoding = false;
}